

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.h
# Opt level: O0

Vector3D * __thiscall CMU462::Vertex::normal(Vector3D *__return_storage_ptr__,Vertex *this)

{
  bool bVar1;
  pointer pHVar2;
  pointer pVVar3;
  _Self local_1a8;
  _List_const_iterator<CMU462::Halfedge> local_1a0;
  _List_node_base *local_198;
  Vector3D local_190;
  Vector3D local_178;
  Vector3D local_160;
  _List_const_iterator<CMU462::Halfedge> local_148;
  _List_const_iterator<CMU462::Halfedge> local_140;
  _List_const_iterator<CMU462::Vertex> local_138;
  undefined1 local_130 [8];
  Vector3D pk_1;
  _List_const_iterator<CMU462::Vertex> local_110;
  undefined1 local_108 [8];
  Vector3D pj_1;
  _List_const_iterator<CMU462::Halfedge> local_e8;
  _List_node_base *local_e0;
  Vector3D local_d8;
  Vector3D local_c0;
  Vector3D local_a8;
  _List_const_iterator<CMU462::Halfedge> local_90;
  _List_const_iterator<CMU462::Halfedge> local_88;
  _List_const_iterator<CMU462::Vertex> local_80;
  undefined1 local_78 [8];
  Vector3D pk;
  _List_const_iterator<CMU462::Vertex> local_58;
  undefined1 local_50 [8];
  Vector3D pj;
  HalfedgeCIter h;
  Vector3D pi;
  Vertex *this_local;
  Vector3D *N;
  
  Vector3D::Vector3D(__return_storage_ptr__,0.0,0.0,0.0);
  Vector3D::Vector3D((Vector3D *)&h,&this->position);
  pj.z = (double)halfedge(this);
  bVar1 = isBoundary(this);
  if (bVar1) {
    do {
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                         ((_List_const_iterator<CMU462::Halfedge> *)&pj.z);
      pk.z = (double)Halfedge::next(pHVar2);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                         ((_List_const_iterator<CMU462::Halfedge> *)&pk.z);
      local_58._M_node = (_List_node_base *)Halfedge::vertex(pHVar2);
      pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_58);
      Vector3D::Vector3D((Vector3D *)local_50,&pVVar3->position);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                         ((_List_const_iterator<CMU462::Halfedge> *)&pj.z);
      local_90._M_node = (_List_node_base *)Halfedge::next(pHVar2);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_90);
      local_88._M_node = (_List_node_base *)Halfedge::next(pHVar2);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_88);
      local_80._M_node = (_List_node_base *)Halfedge::vertex(pHVar2);
      pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_80);
      Vector3D::Vector3D((Vector3D *)local_78,&pVVar3->position);
      Vector3D::operator-(&local_c0,(Vector3D *)local_50,(Vector3D *)&h);
      Vector3D::operator-(&local_d8,(Vector3D *)local_78,(Vector3D *)&h);
      cross(&local_a8,&local_c0,&local_d8);
      Vector3D::operator+=(__return_storage_ptr__,&local_a8);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                         ((_List_const_iterator<CMU462::Halfedge> *)&pj.z);
      local_e8._M_node = (_List_node_base *)Halfedge::next(pHVar2);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_e8);
      local_e0 = (_List_node_base *)Halfedge::twin(pHVar2);
      pj.z = (double)local_e0;
      pj_1.z = (double)halfedge(this);
      bVar1 = std::operator!=((_Self *)&pj.z,(_Self *)&pj_1.z);
    } while (bVar1);
  }
  else {
    do {
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                         ((_List_const_iterator<CMU462::Halfedge> *)&pj.z);
      pk_1.z = (double)Halfedge::next(pHVar2);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                         ((_List_const_iterator<CMU462::Halfedge> *)&pk_1.z);
      local_110._M_node = (_List_node_base *)Halfedge::vertex(pHVar2);
      pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_110);
      Vector3D::Vector3D((Vector3D *)local_108,&pVVar3->position);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                         ((_List_const_iterator<CMU462::Halfedge> *)&pj.z);
      local_148._M_node = (_List_node_base *)Halfedge::next(pHVar2);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_148);
      local_140._M_node = (_List_node_base *)Halfedge::next(pHVar2);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_140);
      local_138._M_node = (_List_node_base *)Halfedge::vertex(pHVar2);
      pVVar3 = std::_List_const_iterator<CMU462::Vertex>::operator->(&local_138);
      Vector3D::Vector3D((Vector3D *)local_130,&pVVar3->position);
      Vector3D::operator-(&local_178,(Vector3D *)local_108,(Vector3D *)&h);
      Vector3D::operator-(&local_190,(Vector3D *)local_130,(Vector3D *)&h);
      cross(&local_160,&local_178,&local_190);
      Vector3D::operator+=(__return_storage_ptr__,&local_160);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->
                         ((_List_const_iterator<CMU462::Halfedge> *)&pj.z);
      local_1a0._M_node = (_List_node_base *)Halfedge::twin(pHVar2);
      pHVar2 = std::_List_const_iterator<CMU462::Halfedge>::operator->(&local_1a0);
      local_198 = (_List_node_base *)Halfedge::next(pHVar2);
      pj.z = (double)local_198;
      local_1a8._M_node = (_List_node_base *)halfedge(this);
      bVar1 = std::operator!=((_Self *)&pj.z,&local_1a8);
    } while (bVar1);
  }
  Vector3D::normalize(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Vector3D normal() const {
          Vector3D N( 0., 0., 0. );
          Vector3D pi = position;

          // Iterate over neighbors.
          HalfedgeCIter h = halfedge();
          if (isBoundary()) {
            do {
              Vector3D pj = h->next()->vertex()->position;
              Vector3D pk = h->next()->next()->vertex()->position;
              N += cross( pj-pi, pk-pi );
              h = h->next()->twin();
            } while( h != halfedge() );      
          } else {
            do {
              Vector3D pj = h->next()->vertex()->position;
              Vector3D pk = h->next()->next()->vertex()->position;
              N += cross( pj-pi, pk-pi );
              h = h->twin()->next();
            } while( h != halfedge() );
          }

          N.normalize();

          return N;
        }